

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O1

void do_recall(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar4;
  char buf [4608];
  char local_1228 [4608];
  
  bVar1 = is_npc(ch);
  if ((bVar1) && ((ch->act[0] & 0x100) == 0)) {
    pcVar4 = "Only players can recall.\n\r";
  }
  else if ((ch->level < 0x10) || ((bVar1 = is_immortal(ch), bVar1 || (ch->ghost != 0)))) {
    act("$n prays for transportation!",ch,(void *)0x0,(void *)0x0,0);
    pRoomIndex = get_room_index(0);
    if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
      pcVar4 = "Your temple has been destroyed...pray to the Gods for help!\n\r";
    }
    else {
      if (ch->in_room == pRoomIndex) {
        return;
      }
      if ((ch->in_room->room_flags[0] & 0x2000) == 0) {
        pcVar4 = (char *)0xa;
        bVar1 = is_affected_by(ch,10);
        if (!bVar1) {
          if (ch->fighting != (CHAR_DATA *)0x0) {
            iVar2 = get_skill(ch,(int)gsn_recall);
            iVar3 = number_percent();
            if (iVar3 < (iVar2 * 0x50) / 100) {
              check_improve(ch,(int)gsn_recall,false,6);
              WAIT_STATE(ch,4);
              builtin_strncpy(local_1228 + 8,"ed!\n\r",6);
              builtin_strncpy(local_1228,"You fail",8);
              send_to_char(local_1228,ch);
              return;
            }
            check_improve(ch,(int)gsn_recall,true,4);
            builtin_strncpy(local_1228 + 0x10,"combat!\n\r",10);
            builtin_strncpy(local_1228,"You recall from ",0x10);
            send_to_char(local_1228,ch);
            pcVar4 = (char *)0x1;
            stop_fighting(ch,true);
          }
          un_watermeld(ch,pcVar4);
          ch->move = (short)((uint)(int)(short)(ch->move - (ch->move >> 0xf)) >> 1);
          act("$n disappears.",ch,(void *)0x0,(void *)0x0,0);
          char_from_room(ch);
          char_to_room(ch,pRoomIndex);
          act("$n appears in the room.",ch,(void *)0x0,(void *)0x0,0);
          pcVar4 = "auto";
          do_look(ch,"auto");
          if (ch->pet == (CHAR_DATA *)0x0) {
            return;
          }
          do_recall(ch->pet,pcVar4);
          return;
        }
      }
      pcVar4 = "The gods have forsaken you.\n\r";
    }
  }
  else {
    pcVar4 = "Those who have passed the 15th rank cannot recall.\n\r";
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_recall(CHAR_DATA *ch, char *argument)
{
	if (is_npc(ch) && !IS_SET(ch->act, ACT_PET))
	{
		send_to_char("Only players can recall.\n\r", ch);
		return;
	}

	if (ch->level > 15 && !is_immortal(ch) && !ch->ghost)
	{
		send_to_char("Those who have passed the 15th rank cannot recall.\n\r", ch);
		return;
	}

	act("$n prays for transportation!", ch, 0, 0, TO_ROOM);

	auto location = get_room_index(hometown_table[ch->hometown].recall);
	if (location == nullptr)
	{
		send_to_char("Your temple has been destroyed...pray to the Gods for help!\n\r", ch);
		return;
	}

	if (ch->in_room == location)
		return;

	if (IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL) || is_affected_by(ch, AFF_CURSE))
	{
		send_to_char("The gods have forsaken you.\n\r", ch);
		return;
	}

	auto victim = ch->fighting;
	if (victim != nullptr)
	{
		char buf[MAX_STRING_LENGTH];
		auto skill = get_skill(ch, gsn_recall);

		if (number_percent() < 80 * skill / 100)
		{
			check_improve(ch, gsn_recall, false, 6);

			WAIT_STATE(ch, 4);

			sprintf(buf, "You failed!\n\r");
			send_to_char(buf, ch);
			return;
		}

		check_improve(ch, gsn_recall, true, 4);
		sprintf(buf, "You recall from combat!\n\r");
		send_to_char(buf, ch);
		stop_fighting(ch, true);
	}

	un_watermeld(ch, nullptr);

	ch->move /= 2;

	act("$n disappears.", ch, nullptr, nullptr, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, location);

	act("$n appears in the room.", ch, nullptr, nullptr, TO_ROOM);

	do_look(ch, "auto");

	if (ch->pet != nullptr)
		do_recall(ch->pet, "");
}